

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O2

void __thiscall runtime::VirtualMachine::pushStackFrame(VirtualMachine *this,Function *function)

{
  size_t i;
  ulong uVar1;
  value_type local_48;
  undefined1 local_38 [8];
  shared_ptr<runtime::StackFrame> newFrame;
  
  std::make_shared<runtime::StackFrame>();
  for (uVar1 = 0; uVar1 < function->fn->localsCount; uVar1 = uVar1 + 1) {
    local_48.type = Undefined;
    local_48._4_4_ = 0;
    local_48.field_1.integerValue = 0;
    std::vector<runtime::Variable,_std::allocator<runtime::Variable>_>::push_back
              ((vector<runtime::Variable,_std::allocator<runtime::Variable>_> *)((long)local_38 + 8)
               ,&local_48);
  }
  std::__shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2> *)
             ((long)local_38 + 0x28),
             &(this->stackFrame).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>
            );
  *(size_t *)local_38 = 0;
  *(Function **)((long)local_38 + 0x20) = function;
  std::__shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->stackFrame).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>
             ,(__shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2> *)local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&newFrame);
  return;
}

Assistant:

void runtime::VirtualMachine::pushStackFrame(const runtime::Function* function) {
  auto newFrame = std::make_shared<StackFrame>();

  for (std::size_t i = 0; i < function->fn->localsCount; i++) {
    Variable undefined{};
    undefined.type = VariableType::Undefined;
    newFrame->locals.push_back(undefined);
  }

  newFrame->outer = this->stackFrame;
  newFrame->programCounter = 0;
  newFrame->function = function;

  this->stackFrame = newFrame;
}